

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.h
# Opt level: O1

void __thiscall caffe::V1LayerParameter::add_top(V1LayerParameter *this,string *value)

{
  int iVar1;
  Rep *pRVar2;
  Arena *this_00;
  string *elem;
  
  pRVar2 = (this->top_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar2 == (Rep *)0x0) {
LAB_00441c90:
    google::protobuf::internal::RepeatedPtrFieldBase::Reserve
              (&(this->top_).super_RepeatedPtrFieldBase,
               (this->top_).super_RepeatedPtrFieldBase.total_size_ + 1);
  }
  else {
    iVar1 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar2->allocated_size) {
      (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      elem = (string *)pRVar2->elements[iVar1];
      goto LAB_00441d22;
    }
    if (pRVar2->allocated_size == (this->top_).super_RepeatedPtrFieldBase.total_size_)
    goto LAB_00441c90;
  }
  pRVar2 = (this->top_).super_RepeatedPtrFieldBase.rep_;
  pRVar2->allocated_size = pRVar2->allocated_size + 1;
  this_00 = (this->top_).super_RepeatedPtrFieldBase.arena_;
  if (this_00 == (Arena *)0x0) {
    elem = (string *)operator_new(0x20);
    *(string **)elem = elem + 0x10;
    *(long *)(elem + 8) = 0;
    elem[0x10] = (string)0x0;
  }
  else {
    elem = (string *)
           google::protobuf::Arena::AllocateAligned
                     (this_00,(type_info *)&std::__cxx11::string::typeinfo,0x20);
    *(string **)elem = elem + 0x10;
    *(long *)(elem + 8) = 0;
    elem[0x10] = (string)0x0;
    google::protobuf::Arena::AddListNode
              (this_00,elem,google::protobuf::internal::arena_destruct_object<std::__cxx11::string>)
    ;
  }
  pRVar2 = (this->top_).super_RepeatedPtrFieldBase.rep_;
  iVar1 = (this->top_).super_RepeatedPtrFieldBase.current_size_;
  (this->top_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
  pRVar2->elements[iVar1] = elem;
LAB_00441d22:
  std::__cxx11::string::_M_assign(elem);
  return;
}

Assistant:

inline void V1LayerParameter::add_top(const ::std::string& value) {
  top_.Add()->assign(value);
  // @@protoc_insertion_point(field_add:caffe.V1LayerParameter.top)
}